

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O2

error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_byte_span> *
__thiscall
pstore::http::
buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
::get_span_impl(error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_byte_span>
                *__return_storage_ptr__,
               buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
               *this,descriptor<pstore::details::posix_descriptor_traits> *io,byte_span *sp)

{
  maybe<unsigned_char,_void> *this_00;
  iterator *other;
  uchar uVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  anon_struct_8_0_00000001_for___align aVar3;
  pointer peVar4;
  bool bVar5;
  bool bVar6;
  uchar *puVar7;
  reference peVar8;
  extent_type<_1L> eVar9;
  descriptor<pstore::details::posix_descriptor_traits> *rhs;
  anon_struct_8_0_00000001_for___align *paVar10;
  difference_type dVar11;
  span<unsigned_char,__1L> *psVar12;
  error_code eVar13;
  error_code erc;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_d8;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_byte_span>
  *local_c0;
  byte_span *local_b8;
  span<unsigned_char,__1L> *local_b0;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *local_a8;
  anon_union_24_2_eb5a95ea_for_error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_1
  local_a0;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<std::uint8_t>::iterator>
  x;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_60;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_40;
  
  eVar9.size_ = (sp->storage_).super_extent_type<_1L>.size_;
  local_d8 = sp->storage_;
  local_c0 = __return_storage_ptr__;
  local_b8 = sp;
  if (((this->push_).valid_ == true) && (0 < (sp->storage_).super_extent_type<_1L>.size_)) {
    this_00 = &this->push_;
    puVar7 = maybe<unsigned_char,_void>::operator->(this_00);
    uVar1 = *puVar7;
    peVar8 = pstore::gsl::span<unsigned_char,_-1L>::operator[](sp,0);
    *peVar8 = uVar1;
    if (this_00->valid_ == true) {
      this_00->valid_ = false;
    }
    local_d8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::span<unsigned_char,_-1L>::subspan
                         ((span<unsigned_char,__1L> *)&local_d8,1,-1);
    eVar9 = local_d8.super_extent_type<_1L>.size_;
  }
  other = &this->pos_;
  local_a8 = &this->end_;
  psVar12 = &this->span_;
  local_b0 = psVar12;
  do {
    if ((eVar9.size_ == 0) || (this->is_eof_ != false)) {
      peVar4 = (local_b8->storage_).data_;
      pstore::gsl::details::extent_type<-1L>::extent_type
                ((extent_type<_1L> *)&x,(long)local_d8.data_ - (long)peVar4);
      x.field_0._8_8_ = peVar4;
      error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>>>
      ::
      error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>
                ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>
                  *)local_c0,io,&x);
      return local_c0;
    }
    if (((this->pos_).span_ == (this->end_).span_) && ((this->pos_).index_ == (this->end_).index_))
    {
      (*this->refill_)((error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                        *)&local_a0,io,psVar12);
      error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
      ::
      error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>,void>
                (&x,(error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                     *)&local_a0);
      error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
      ::~error_or((error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                   *)&local_a0);
      if (x.has_error_ == true) {
        eVar13 = error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
                 ::get_error(&x);
        erc._M_cat = eVar13._M_cat;
        erc._4_4_ = 0;
        erc._M_value = eVar13._M_value;
        error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::span<unsigned_char,_-1L>_>_>
        ::error_or(local_c0,erc);
        error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
        ::~error_or(&x);
        return local_c0;
      }
      rhs = get<0ul,pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
                      (&x);
      pstore::details::descriptor<pstore::details::posix_descriptor_traits>::operator=(io,rhs);
      paVar10 = (anon_struct_8_0_00000001_for___align *)
                error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
                ::
                value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                          (&x);
      pstore::gsl::span<unsigned_char,_-1L>::begin
                ((span<unsigned_char,__1L> *)&local_a0.error_storage_);
      aVar2 = *paVar10;
      aVar3 = paVar10[1];
      bVar5 = (anon_struct_8_0_00000001_for___align)local_a0._8_8_ == aVar3;
      bVar6 = local_a0.storage_.__align == aVar2;
      if (bVar5 && bVar6) {
        this->is_eof_ = true;
        aVar2 = (anon_struct_8_0_00000001_for___align)(local_b8->storage_).data_;
        pstore::gsl::details::extent_type<-1L>::extent_type
                  ((extent_type<_1L> *)&local_a0,(long)local_d8.data_ - (long)aVar2);
        psVar12 = local_b0;
        local_a0._8_8_ = aVar2;
        error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>>>
        ::
        error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>
                  ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>
                    *)local_c0,io,&local_a0);
      }
      else {
        (this->end_).span_ = (span<unsigned_char,__1L> *)aVar2;
        (this->end_).index_ = (ptrdiff_t)aVar3;
        pstore::gsl::span<unsigned_char,_-1L>::begin
                  ((span<unsigned_char,__1L> *)&local_a0.error_storage_);
        (this->pos_).span_ = (span<unsigned_char,__1L> *)local_a0.storage_._0_8_;
        (this->pos_).index_ = local_a0._8_8_;
      }
      error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
      ::~error_or(&x);
      if (bVar5 && bVar6) {
        return local_c0;
      }
    }
    check_invariants(this);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_40,other);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_50,local_a8);
    dVar11 = std::
             distance<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
                       (&local_40,&local_50);
    eVar9.size_ = local_d8.super_extent_type<_1L>.size_;
    if (dVar11 <= local_d8.super_extent_type<_1L>.size_) {
      eVar9.size_ = dVar11;
    }
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_60,other);
    std::
    copy_n<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>,long,unsigned_char*>
              (&local_60,eVar9.size_,local_d8.data_);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+=
              (other,eVar9.size_);
    local_d8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::span<unsigned_char,_-1L>::subspan
                         ((span<unsigned_char,__1L> *)&local_d8,eVar9.size_,-1);
    eVar9 = local_d8.super_extent_type<_1L>.size_;
  } while( true );
}

Assistant:

auto buffered_reader<IO, RefillFunction>::get_span_impl (IO io, byte_span const & sp)
            -> error_or_n<IO, byte_span> {

            auto available = sp;
            if (push_ && sp.size () > 0) {
                sp[0] = *push_;
                push_.reset ();
                available = available.subspan (1);
            }

            while (!available.empty () && !is_eof_) {
                if (pos_ == end_) {
                    // Refill the buffer.
                    error_or_n<IO, gsl::span<std::uint8_t>::iterator> x = refill_ (io, span_);
                    if (!x) {
                        return error_or_n<IO, byte_span>{x.get_error ()};
                    }
                    io = std::move (get<0> (x));
                    auto const & end = get<1> (x);
                    if (end == span_.begin ()) {
                        // that's the end of the source data.
                        is_eof_ = true;
                        return error_or_n<IO, byte_span>{
                            in_place, io, byte_span{sp.data (), available.data () - sp.data ()}};
                    }

                    end_ = end;
                    pos_ = span_.begin ();
                }

                // If we have bytes in the buffer, copy as many as we can.

                this->check_invariants ();
                auto const to_copy = std::min (std::distance (pos_, end_), available.size ());
                std::copy_n (pos_, to_copy, available.data ());
                pos_ += to_copy;
                available = available.subspan (to_copy);
            }
            return error_or_n<IO, byte_span>{in_place, io,
                                             byte_span{sp.data (), available.data () - sp.data ()}};
        }